

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::get_pred_per_update<false,false,false,0ul,1ul,2ul,true>(gd *g,example *ec)

{
  long in_RSI;
  float *in_RDI;
  float fVar1;
  float tw;
  float nsnx;
  norm_data nd;
  float grad_squared;
  vw *all;
  label_data *ld;
  example *ec_00;
  example *all_00;
  undefined1 local_38 [12];
  float local_2c;
  uchar *local_28;
  size_t local_20;
  float *local_10;
  
  local_20 = in_RSI + 0x6828;
  local_28 = *(uchar **)(in_RDI + 0x18);
  local_2c = *(float *)(in_RSI + 0x6870);
  local_10 = in_RDI;
  fVar1 = (float)(**(code **)(**(long **)(local_28 + 0x3548) + 0x28))
                           (*(undefined4 *)(in_RSI + 0x6850));
  local_2c = fVar1 * local_2c;
  all_00 = (example *)local_38;
  ec_00 = (example *)&stack0xffffffffffffffd4;
  do {
    *(undefined4 *)&(all_00->super_example_predict).indices._begin = 0;
    all_00 = (example *)((long)&(all_00->super_example_predict).indices._begin + 4);
  } while (all_00 != ec_00);
  foreach_feature<GD::norm_data,_&GD::pred_per_update_feature>
            ((vw *)all_00,ec_00,(norm_data *)0x2011e4);
  fVar1 = average_update<false,0ul,1ul>
                    ((float)((ulong)all_00 >> 0x20),SUB84(all_00,0),(float)((ulong)ec_00 >> 0x20));
  local_10[10] = fVar1;
  return local_10[10] * 0.0;
}

Assistant:

float get_pred_per_update(gd& g, example& ec)
{
  // We must traverse the features in _precisely_ the same order as during training.
  label_data& ld = ec.l.simple;
  vw& all = *g.all;

  float grad_squared = ec.weight;
  if (!adax)
    grad_squared *= all.loss->getSquareGrad(ec.pred.scalar, ld.label);

  if (grad_squared == 0 && !stateless)
    return 1.;

  norm_data nd = {grad_squared, 0., 0., {g.neg_power_t, g.neg_norm_power}, {0}};
  foreach_feature<norm_data,
      pred_per_update_feature<sqrt_rate, feature_mask_off, adaptive, normalized, spare, stateless> >(all, ec, nd);
  if (normalized)
  {
    if (!stateless)
    {
      g.all->normalized_sum_norm_x += ((double)ec.weight) * nd.norm_x;
      g.total_weight += ec.weight;
      g.update_multiplier = average_update<sqrt_rate, adaptive, normalized>(
          (float)g.total_weight, (float)g.all->normalized_sum_norm_x, g.neg_norm_power);
    }
    else
    {
      float nsnx = ((float)g.all->normalized_sum_norm_x) + ec.weight * nd.norm_x;
      float tw = (float)g.total_weight + ec.weight;
      g.update_multiplier = average_update<sqrt_rate, adaptive, normalized>(tw, nsnx, g.neg_norm_power);
    }
    nd.pred_per_update *= g.update_multiplier;
  }
  return nd.pred_per_update;
}